

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O0

void __thiscall
TEST_TestRegistry_ResetPluginsWorks_TestShell::~TEST_TestRegistry_ResetPluginsWorks_TestShell
          (TEST_TestRegistry_ResetPluginsWorks_TestShell *this)

{
  TEST_TestRegistry_ResetPluginsWorks_TestShell *this_local;
  
  ~TEST_TestRegistry_ResetPluginsWorks_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestRegistry, ResetPluginsWorks)
{
    MyTestPluginDummy plugin1("Plugin-1");
    MyTestPluginDummy plugin2("Plugin-2");
    myRegistry->installPlugin(&plugin1);
    myRegistry->installPlugin(&plugin2);
    LONGS_EQUAL(2, myRegistry->countPlugins());
    myRegistry->resetPlugins();
    LONGS_EQUAL(0, myRegistry->countPlugins());
}